

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventfd-bi.c
# Opt level: O2

void server_communicate(int descriptor,Arguments *args)

{
  int iVar1;
  Benchmarks bench;
  
  setup_benchmarks(&bench);
  for (iVar1 = 0; iVar1 < args->count; iVar1 = iVar1 + 1) {
    bench.single_start = now();
    eventfd_wait(descriptor,1);
    eventfd_notify(descriptor,2);
    benchmark(&bench);
  }
  args->size = 1;
  evaluate(&bench,args);
  return;
}

Assistant:

void server_communicate(int descriptor, struct Arguments* args) {
	struct Benchmarks bench;
	int message;

	setup_benchmarks(&bench);

	for (message = 0; message < args->count; ++message) {
		bench.single_start = now();

		eventfd_wait(descriptor, SERVER_TOKEN);
		eventfd_notify(descriptor, CLIENT_TOKEN);

		benchmark(&bench);
	}

	// The message size is always one (it's just a signal)
	args->size = 1;
	evaluate(&bench, args);
}